

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O0

void Gia_ManPrintStats(Gia_Man_t *p,Gps_Par_t *pPars)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  char *pcVar9;
  float fVar10;
  double dVar11;
  char *local_68;
  float SwiTotal;
  Gps_Par_t *pPars_local;
  Gia_Man_t *p_local;
  
  if ((pPars != (Gps_Par_t *)0x0) && (pPars->fMiter != 0)) {
    Gia_ManPrintStatsMiter(p,0);
    return;
  }
  if (p->pName != (char *)0x0) {
    Abc_Print(1,"%s%-8s%s : ","\x1b[1;37m",p->pName,"\x1b[0m");
  }
  iVar1 = Gia_ManPiNum(p);
  iVar2 = Gia_ManBoxCiNum(p);
  iVar3 = Gia_ManRegBoxNum(p);
  iVar4 = Gia_ManPoNum(p);
  iVar5 = Gia_ManBoxCoNum(p);
  iVar6 = Gia_ManRegBoxNum(p);
  Abc_Print(1,"i/o =%7d/%7d",(ulong)(uint)((iVar1 - iVar2) - iVar3),
            (ulong)(uint)((iVar4 - iVar5) - iVar6));
  iVar1 = Gia_ManConstrNum(p);
  if (iVar1 != 0) {
    uVar7 = Gia_ManConstrNum(p);
    Abc_Print(1,"(c=%d)",(ulong)uVar7);
  }
  iVar1 = Gia_ManRegNum(p);
  if (iVar1 != 0) {
    uVar7 = Gia_ManRegNum(p);
    Abc_Print(1,"  ff =%7d",(ulong)uVar7);
  }
  iVar1 = Gia_ManRegBoxNum(p);
  if (iVar1 != 0) {
    uVar7 = Gia_ManRegBoxNum(p);
    uVar8 = Gia_ManClockDomainNum(p);
    Abc_Print(1,"  boxff =%d(%d)",(ulong)uVar7,(ulong)uVar8);
  }
  pcVar9 = "and";
  if (p->pMuxes != (uint *)0x0) {
    pcVar9 = "nod";
  }
  uVar7 = Gia_ManAndNum(p);
  Abc_Print(1,"  %s%s =%8d%s","\x1b[1;36m",pcVar9,(ulong)uVar7,"\x1b[0m");
  uVar7 = Gia_ManLevelNum(p);
  Abc_Print(1,"  %slev =%5d%s","\x1b[1;35m",(ulong)uVar7,"\x1b[0m");
  fVar10 = Gia_ManLevelAve(p);
  Abc_Print(1," %s(%.2f)%s",(double)fVar10,"\x1b[1;35m");
  Vec_IntFreeP(&p->vLevels);
  if ((pPars != (Gps_Par_t *)0x0) && (pPars->fCut != 0)) {
    uVar7 = Gia_ManCrossCut(p,0);
    Gia_ManCrossCut(p,1);
    Abc_Print(1,"  cut = %d(%d)",(ulong)uVar7);
  }
  dVar11 = Gia_ManMemory(p);
  Abc_Print(1,"  mem =%5.2f MB",dVar11 / 1048576.0);
  iVar1 = Gia_ManHasChoices(p);
  if (iVar1 != 0) {
    uVar7 = Gia_ManChoiceNum(p);
    Abc_Print(1,"  ch =%5d",(ulong)uVar7);
  }
  if (p->pManTime != (void *)0x0) {
    uVar7 = Gia_ManNonRegBoxNum(p);
    Abc_Print(1,"  box = %d",(ulong)uVar7);
  }
  if (p->pManTime != (void *)0x0) {
    uVar7 = Gia_ManBlackBoxNum(p);
    Abc_Print(1,"  bb = %d",(ulong)uVar7);
  }
  iVar1 = Gia_ManBufNum(p);
  if (iVar1 != 0) {
    uVar7 = Gia_ManBufNum(p);
    Abc_Print(1,"  buf = %d",(ulong)uVar7);
  }
  if ((pPars != (Gps_Par_t *)0x0) && (pPars->fMuxXor != 0)) {
    printf("\nXOR/MUX ");
    Gia_ManPrintMuxStats(p);
  }
  if ((pPars != (Gps_Par_t *)0x0) && (pPars->fSwitch != 0)) {
    fVar10 = Gia_ManComputeSwitching(p,0x30,0x10,0);
    Abc_Print(1,"  power =%8.1f",(double)fVar10);
    iVar1 = Gia_ManPrintStats::nPiPo;
    if (0.0 < Gia_ManPrintStats::PrevSwiTotal) {
      iVar2 = Gia_ManCiNum(p);
      iVar3 = Gia_ManCoNum(p);
      if (iVar1 == iVar2 + iVar3) {
        Abc_Print(1," %6.2f %%",
                  ((double)(Gia_ManPrintStats::PrevSwiTotal - fVar10) * 100.0) /
                  (double)Gia_ManPrintStats::PrevSwiTotal);
        goto LAB_00925b7a;
      }
    }
    iVar1 = Gia_ManPrintStats::nPiPo;
    if ((Gia_ManPrintStats::PrevSwiTotal != 0.0) || (NAN(Gia_ManPrintStats::PrevSwiTotal))) {
      iVar2 = Gia_ManCiNum(p);
      iVar3 = Gia_ManCoNum(p);
      if (iVar1 == iVar2 + iVar3) goto LAB_00925b7a;
    }
    Gia_ManPrintStats::PrevSwiTotal = fVar10;
    iVar1 = Gia_ManCiNum(p);
    iVar2 = Gia_ManCoNum(p);
    Gia_ManPrintStats::nPiPo = iVar1 + iVar2;
  }
LAB_00925b7a:
  Abc_Print(1,"\n");
  if ((p->pReprs != (Gia_Rpr_t *)0x0) && (p->pNexts != (int *)0x0)) {
    Gia_ManEquivPrintClasses(p,0,0.0);
  }
  iVar1 = Gia_ManHasMapping(p);
  if ((iVar1 != 0) && ((pPars == (Gps_Par_t *)0x0 || (pPars->fSkipMap == 0)))) {
    if (pPars == (Gps_Par_t *)0x0) {
      local_68 = (char *)0x0;
    }
    else {
      local_68 = pPars->pDumpFile;
    }
    Gia_ManPrintMappingStats(p,local_68);
  }
  if ((((pPars != (Gps_Par_t *)0x0) && (pPars->fNpn != 0)) &&
      (iVar1 = Gia_ManHasMapping(p), iVar1 != 0)) && (iVar1 = Gia_ManLutSizeMax(p), iVar1 < 5)) {
    Gia_ManPrintNpnClasses(p);
  }
  if (p->vPacking != (Vec_Int_t *)0x0) {
    Gia_ManPrintPackingStats(p);
  }
  if (((pPars != (Gps_Par_t *)0x0) && (pPars->fLutProf != 0)) &&
     (iVar1 = Gia_ManHasMapping(p), iVar1 != 0)) {
    Gia_ManPrintLutStats(p);
  }
  if (p->pPlacement != (Gia_Plc_t *)0x0) {
    Gia_ManPrintPlacement(p);
  }
  Gia_ManPrintFlopClasses(p);
  Gia_ManPrintGateClasses(p);
  Gia_ManPrintObjClasses(p);
  if (p->vInitClasses != (Vec_Int_t *)0x0) {
    Gia_ManPrintInitClasses(p->vInitClasses);
  }
  Gia_ManCheckIntegrityWithBoxes(p);
  if ((pPars != (Gps_Par_t *)0x0) && (pPars->fTents != 0)) {
    Gia_ManPrintTents(p);
  }
  return;
}

Assistant:

void Gia_ManPrintStats( Gia_Man_t * p, Gps_Par_t * pPars )
{
    extern float Gia_ManLevelAve( Gia_Man_t * p );
    if ( pPars && pPars->fMiter )
    {
        Gia_ManPrintStatsMiter( p, 0 );
        return;
    }
#ifdef WIN32
    SetConsoleTextAttribute( GetStdHandle(STD_OUTPUT_HANDLE), 15 ); // bright
    if ( p->pName )
        Abc_Print( 1, "%-8s : ", p->pName );
    SetConsoleTextAttribute( GetStdHandle(STD_OUTPUT_HANDLE), 7 );  // normal
#else
    if ( p->pName )
        Abc_Print( 1, "%s%-8s%s : ", "\033[1;37m", p->pName, "\033[0m" );  // bright
#endif
    Abc_Print( 1, "i/o =%7d/%7d", 
        Gia_ManPiNum(p) - Gia_ManBoxCiNum(p) - Gia_ManRegBoxNum(p), 
        Gia_ManPoNum(p) - Gia_ManBoxCoNum(p) - Gia_ManRegBoxNum(p) );
    if ( Gia_ManConstrNum(p) )
        Abc_Print( 1, "(c=%d)", Gia_ManConstrNum(p) );
    if ( Gia_ManRegNum(p) )
        Abc_Print( 1, "  ff =%7d", Gia_ManRegNum(p) );
    if ( Gia_ManRegBoxNum(p) )
        Abc_Print( 1, "  boxff =%d(%d)", Gia_ManRegBoxNum(p), Gia_ManClockDomainNum(p) );

#ifdef WIN32
    {
    HANDLE hConsole = GetStdHandle(STD_OUTPUT_HANDLE);
    SetConsoleTextAttribute( hConsole, 11 ); // blue
    Abc_Print( 1, "  %s =%8d", p->pMuxes? "nod" : "and", Gia_ManAndNum(p) );
    SetConsoleTextAttribute( hConsole, 13 ); // magenta
    Abc_Print( 1, "  lev =%5d", Gia_ManLevelNum(p) ); 
    Abc_Print( 1, " (%.2f)", Gia_ManLevelAve(p) ); 
    SetConsoleTextAttribute( hConsole, 7 ); // normal
    }
#else
    Abc_Print( 1, "  %s%s =%8d%s",  "\033[1;36m", p->pMuxes? "nod" : "and", Gia_ManAndNum(p), "\033[0m" ); // blue
    Abc_Print( 1, "  %slev =%5d%s", "\033[1;35m", Gia_ManLevelNum(p), "\033[0m" ); // magenta
    Abc_Print( 1, " %s(%.2f)%s",    "\033[1;35m", Gia_ManLevelAve(p), "\033[0m" ); 
#endif
    Vec_IntFreeP( &p->vLevels );
    if ( pPars && pPars->fCut )
        Abc_Print( 1, "  cut = %d(%d)", Gia_ManCrossCut(p, 0), Gia_ManCrossCut(p, 1) );
    Abc_Print( 1, "  mem =%5.2f MB", Gia_ManMemory(p)/(1<<20) );
    if ( Gia_ManHasChoices(p) )
        Abc_Print( 1, "  ch =%5d", Gia_ManChoiceNum(p) );
	if ( p->pManTime )
		Abc_Print( 1, "  box = %d", Gia_ManNonRegBoxNum(p) );
	if ( p->pManTime )
		Abc_Print( 1, "  bb = %d", Gia_ManBlackBoxNum(p) );
    if ( Gia_ManBufNum(p) )
		Abc_Print( 1, "  buf = %d", Gia_ManBufNum(p) );
    if ( pPars && pPars->fMuxXor )
        printf( "\nXOR/MUX " ), Gia_ManPrintMuxStats( p );
    if ( pPars && pPars->fSwitch )
    {
        static int nPiPo = 0;
        static float PrevSwiTotal = 0;
        float SwiTotal = Gia_ManComputeSwitching( p, 48, 16, 0 );
        Abc_Print( 1, "  power =%8.1f", SwiTotal );
        if ( PrevSwiTotal > 0 && nPiPo == Gia_ManCiNum(p) + Gia_ManCoNum(p) )
            Abc_Print( 1, " %6.2f %%", 100.0*(PrevSwiTotal-SwiTotal)/PrevSwiTotal );
        else if ( PrevSwiTotal == 0 || nPiPo != Gia_ManCiNum(p) + Gia_ManCoNum(p) )
            PrevSwiTotal = SwiTotal, nPiPo = Gia_ManCiNum(p) + Gia_ManCoNum(p);
    }
//    Abc_Print( 1, "obj =%5d  ", Gia_ManObjNum(p) );
    Abc_Print( 1, "\n" );

//    Gia_ManSatExperiment( p );
    if ( p->pReprs && p->pNexts )
        Gia_ManEquivPrintClasses( p, 0, 0.0 );
    if ( Gia_ManHasMapping(p) && (pPars == NULL || !pPars->fSkipMap) )
        Gia_ManPrintMappingStats( p, pPars ? pPars->pDumpFile : NULL );
    if ( pPars && pPars->fNpn && Gia_ManHasMapping(p) && Gia_ManLutSizeMax(p) <= 4 )
        Gia_ManPrintNpnClasses( p );
    if ( p->vPacking )
        Gia_ManPrintPackingStats( p );
    if ( pPars && pPars->fLutProf && Gia_ManHasMapping(p) )
        Gia_ManPrintLutStats( p );
    if ( p->pPlacement )
        Gia_ManPrintPlacement( p );
//    if ( p->pManTime )
//        Tim_ManPrintStats( (Tim_Man_t *)p->pManTime, p->nAnd2Delay );
    Gia_ManPrintFlopClasses( p );
    Gia_ManPrintGateClasses( p );
    Gia_ManPrintObjClasses( p );
//    if ( p->vRegClasses )
//    {
//        printf( "The design has %d flops with the following class info: ", Vec_IntSize(p->vRegClasses) );
//        Vec_IntPrint( p->vRegClasses );
//    }
    if ( p->vInitClasses )
        Gia_ManPrintInitClasses( p->vInitClasses );
    // check integrity of boxes
    Gia_ManCheckIntegrityWithBoxes( p );
/*
    if ( Gia_ManRegBoxNum(p) )
    {
        int i, Limit = Vec_IntFindMax(p->vRegClasses);
        for ( i = 1; i <= Limit; i++ )
            printf( "%d ", Vec_IntCountEntry(p->vRegClasses, i) );
        printf( "\n" );
    }
*/
    if ( pPars && pPars->fTents )
    {
/*
        int k, Entry, Prev = 1;
        Vec_Int_t * vLimit = Vec_IntAlloc( 1000 );
        Gia_Man_t * pNew = Gia_ManUnrollDup( p, vLimit );
        Abc_Print( 1, "Tents:  " );
        Vec_IntForEachEntryStart( vLimit, Entry, k, 1 )
            Abc_Print( 1, "%d=%d  ", k, Entry-Prev ), Prev = Entry;
        Abc_Print( 1, " Unused=%d.", Gia_ManObjNum(p) - Gia_ManObjNum(pNew) );
        Abc_Print( 1, "\n" );
        Vec_IntFree( vLimit );
        Gia_ManStop( pNew );
*/
        Gia_ManPrintTents( p );
    }
}